

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer *
helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,complex<double> *val)

{
  json_value jVar1;
  value_t vVar2;
  char *pcVar3;
  undefined8 uVar4;
  string *val_00;
  reference pvVar5;
  undefined4 in_register_00000034;
  string *this;
  double dVar6;
  string_view valname;
  initializer_list<double> __l;
  initializer_list_t init;
  vector<double,_std::allocator<double>_> vectorVal;
  json jsonArray;
  json json;
  double local_40;
  data local_38;
  data local_28;
  
  this = (string *)&vectorVal;
  jVar1 = (json_value)((json_value *)(val->_M_value + 8))->number_float;
  if ((jVar1.number_float == 0.0) && (!NAN(jVar1.number_float))) {
    typeConvert(__return_storage_ptr__,type,*(double *)val->_M_value);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsComplexString_abi_cxx11_
              ((string *)&vectorVal,(helics *)CONCAT44(in_register_00000034,type),
               *(double *)val->_M_value,jVar1.number_float);
    json.m_data._0_8_ =
         vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    json.m_data.m_value.object =
         (object_t *)
         vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    goto LAB_001f1f6b;
  case HELICS_DOUBLE:
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)std::abs<double>(val);
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&vectorVal);
    break;
  case HELICS_INT:
    dVar6 = std::abs<double>(val);
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(long)dVar6;
    goto LAB_001f1f0d;
  case HELICS_VECTOR:
    json.m_data._0_8_ = *(undefined8 *)val->_M_value;
    __l._M_len = 2;
    __l._M_array = (iterator)&json;
    json.m_data.m_value = jVar1;
    std::vector<double,_std::allocator<double>_>::vector
              (&vectorVal,__l,(allocator_type *)&jsonArray);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,&vectorVal);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vectorVal.super__Vector_base<double,_std::allocator<double>_>);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,val,1);
    break;
  case HELICS_NAMED_POINT:
    helicsComplexString_abi_cxx11_
              ((string *)&json,(helics *)CONCAT44(in_register_00000034,type),
               *(double *)val->_M_value,jVar1.number_float);
    jVar1 = json.m_data.m_value;
    uVar4 = json.m_data._0_8_;
    dVar6 = nan("0");
    valname._M_str = (char *)uVar4;
    valname._M_len = (size_t)jVar1.object;
    NamedPoint::NamedPoint((NamedPoint *)&vectorVal,valname,dVar6);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&vectorVal);
    std::__cxx11::string::~string((string *)&vectorVal);
    this = (string *)&json;
LAB_001f1f6b:
    std::__cxx11::string::~string(this);
    break;
  case HELICS_BOOL:
    dVar6 = std::abs<double>(val);
    pcVar3 = "+0";
    if (dVar6 != 0.0) {
      pcVar3 = "*1";
    }
    if (NAN(dVar6)) {
      pcVar3 = "*1";
    }
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(pcVar3 + 1);
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&vectorVal
              );
    break;
  case HELICS_TIME:
    dVar6 = std::abs<double>(val);
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)count_time<9,_long>::convert(dVar6);
LAB_001f1f0d:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&vectorVal);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_COMPLEX);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar2 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_28.m_type;
      jVar1 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_28.m_value;
      local_28.m_type = vVar2;
      local_28.m_value = jVar1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_28);
      init._M_len = 0;
      init._M_array = (iterator)&jsonArray;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      local_40 = *(double *)val->_M_value;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<double,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&vectorVal,&local_40);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(&jsonArray,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&vectorVal);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&vectorVal);
      local_40 = *(double *)(val->_M_value + 8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<double,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&vectorVal,&local_40);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(&jsonArray,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&vectorVal);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&vectorVal);
      local_38.m_type = jsonArray.m_data.m_type;
      local_38._1_7_ = jsonArray.m_data._1_7_;
      local_38.m_value = jsonArray.m_data.m_value;
      jsonArray.m_data.m_type = null;
      jsonArray.m_data.m_value.object = (object_t *)0x0;
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar2 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_38.m_type;
      local_38.m_type = vVar2;
      jVar1 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_38.m_value;
      local_38.m_value = jVar1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      fileops::generateJsonString((string *)&vectorVal,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vectorVal);
      std::__cxx11::string::~string((string *)&vectorVal);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&jsonArray.m_data);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,val);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const std::complex<double>& val)
{
    if (val.imag() == 0.0) {
        return typeConvert(type, val.real());
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(std::abs(val));
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(std::abs(val)));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(std::abs(val)).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
        default:
            return ValueConverter<std::complex<double>>::convert(val);
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((std::abs(val) != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsComplexString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsComplexString(val), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
            return ValueConverter<std::complex<double>>::convert(&val, 1);
        case DataType::HELICS_VECTOR: {
            const std::vector<double> vectorVal{val.real(), val.imag()};
            return ValueConverter<std::vector<double>>::convert(vectorVal);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_COMPLEX);
            nlohmann::json jsonArray = nlohmann::json::array();
            jsonArray.push_back(val.real());
            jsonArray.push_back(val.imag());
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}